

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O2

size_t rtosc_bundle_size(char *buffer,uint elm)

{
  uint32_t uVar1;
  ulong uVar2;
  uint8_t *arg_pos;
  size_t sVar3;
  bool bVar4;
  
  arg_pos = (uint8_t *)(buffer + 0x10);
  uVar2 = (ulong)(elm + 1);
  sVar3 = 0;
  while( true ) {
    bVar4 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar4) {
      return sVar3;
    }
    uVar1 = extract_uint32(arg_pos);
    if (uVar1 == 0) break;
    sVar3 = (size_t)uVar1;
    arg_pos = arg_pos + (ulong)(uVar1 & 0xfffffffc) + 4;
  }
  return sVar3;
}

Assistant:

size_t rtosc_bundle_size(const char *buffer, unsigned elm)
{
    const uint32_t *lengths = (const uint32_t*) (buffer+16);
    size_t elm_pos = 0;
    size_t last_len = 0;
    while(elm_pos!=elm+1 && extract_uint32((const uint8_t*)lengths)) {
        last_len = extract_uint32((const uint8_t*)lengths);
        ++elm_pos, lengths+=extract_uint32((const uint8_t*)lengths)/4+1;
    }

    return last_len;
}